

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::InitProtobufDefaultsSlow(void)

{
  int iVar1;
  
  if (InitProtobufDefaultsSlow()::is_inited == '\0') {
    iVar1 = __cxa_guard_acquire(&InitProtobufDefaultsSlow()::is_inited);
    if (iVar1 != 0) {
      fixed_address_empty_string_abi_cxx11_ = &DAT_004e1788;
      DAT_004e1780 = 0;
      DAT_004e1788 = 0;
      OnShutdownDestroyString((string *)&fixed_address_empty_string_abi_cxx11_);
      init_protobuf_defaults_state = 1;
      __cxa_guard_release(&InitProtobufDefaultsSlow()::is_inited);
      return;
    }
  }
  return;
}

Assistant:

void InitProtobufDefaultsSlow() {
  static bool is_inited = InitProtobufDefaultsImpl();
  (void)is_inited;
}